

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O2

void __thiscall TcpServer::printEvent(TcpServer *this,int fd,uint32_t events)

{
  map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
  *this_00;
  ushort uVar1;
  ostream *poVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  key_type local_34 [2];
  int fd_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"***********************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"fd: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fd);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = &this->connections;
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_TcpConnection>,_std::_Select1st<std::pair<const_int,_TcpConnection>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
          ::find(&this_00->_M_t,local_34);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->connections)._M_t._M_impl.super__Rb_tree_header) {
    pmVar4 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](this_00,local_34);
    pcVar5 = inet_ntoa((in_addr)(pmVar4->address).sin_addr.s_addr);
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
    poVar2 = std::operator<<(poVar2," : ");
    pmVar4 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](this_00,local_34);
    uVar1 = (pmVar4->address).sin_port;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1 << 8 | uVar1 >> 8);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLIN");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 2) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLPRI");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 4) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLOUT");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 0x40) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLRDNORM");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((char)events < '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLRDBAND");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 8 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLWRNORM");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 9 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLWRBAND");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 10 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLMSG");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 8) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLERR");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events & 0x10) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLHUP");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 0xd & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLRDHUP");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 0x1d & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLWAKEUP");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((events >> 0x1e & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLONESHOT");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((int)events < 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"EPOLLET");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"***********************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void printEvent(int fd, uint32_t events) {
    std::cout << "***********************************************" << std::endl;
    std::cout << "fd: " << fd << std::endl;
    if (connections.find(fd) != connections.cend()) {
      // 有可能是服务端套接字和通知管道套接字，就不能输出地址了
      std::cout << inet_ntoa(connections[fd].address.sin_addr) << " : "
                << ntohs(connections[fd].address.sin_port) << std::endl;
    }
    if (events & EPOLLIN) std::cout << "EPOLLIN" << std::endl;
    if (events & EPOLLPRI) std::cout << "EPOLLPRI" << std::endl;
    if (events & EPOLLOUT) std::cout << "EPOLLOUT" << std::endl;
    if (events & EPOLLRDNORM) std::cout << "EPOLLRDNORM" << std::endl;
    if (events & EPOLLRDBAND) std::cout << "EPOLLRDBAND" << std::endl;
    if (events & EPOLLWRNORM) std::cout << "EPOLLWRNORM" << std::endl;
    if (events & EPOLLWRBAND) std::cout << "EPOLLWRBAND" << std::endl;
    if (events & EPOLLMSG) std::cout << "EPOLLMSG" << std::endl;
    if (events & EPOLLERR) std::cout << "EPOLLERR" << std::endl;
    if (events & EPOLLHUP) std::cout << "EPOLLHUP" << std::endl;
    if (events & EPOLLRDHUP) std::cout << "EPOLLRDHUP" << std::endl;
    if (events & EPOLLWAKEUP) std::cout << "EPOLLWAKEUP" << std::endl;
    if (events & EPOLLONESHOT) std::cout << "EPOLLONESHOT" << std::endl;
    if (events & EPOLLET) std::cout << "EPOLLET" << std::endl;
    std::cout << "***********************************************" << std::endl;
  }